

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void emit_op(JSParseState *s,uint8_t val)

{
  long lVar1;
  DynBuf *s_00;
  long in_RDI;
  DynBuf *bc;
  JSFunctionDef *fd;
  uint32_t in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_RDI + 0x68);
  s_00 = (DynBuf *)(lVar1 + 0x130);
  if (*(int *)(lVar1 + 0x164) != *(int *)(in_RDI + 8)) {
    dbuf_putc(s_00,(uint8_t)(in_stack_ffffffffffffffdc >> 0x18));
    dbuf_put_u32(s_00,in_stack_ffffffffffffffdc);
    *(undefined4 *)(lVar1 + 0x164) = *(undefined4 *)(in_RDI + 8);
  }
  *(int *)(lVar1 + 0x160) = (int)s_00->size;
  dbuf_putc(s_00,(uint8_t)(in_stack_ffffffffffffffdc >> 0x18));
  return;
}

Assistant:

static void emit_op(JSParseState *s, uint8_t val)
{
    JSFunctionDef *fd = s->cur_func;
    DynBuf *bc = &fd->byte_code;

    /* Use the line number of the last token used, not the next token,
       nor the current offset in the source file.
     */
    if (unlikely(fd->last_opcode_line_num != s->last_line_num)) {
        dbuf_putc(bc, OP_line_num);
        dbuf_put_u32(bc, s->last_line_num);
        fd->last_opcode_line_num = s->last_line_num;
    }
    fd->last_opcode_pos = bc->size;
    dbuf_putc(bc, val);
}